

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_wrt.c
# Opt level: O0

size_t tool_write_cb(char *buffer,size_t sz,size_t nmemb,void *userdata)

{
  byte bVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  char *__n;
  void *pvVar5;
  char *pcVar6;
  int res;
  size_t failure;
  _Bool is_tty;
  size_t bytes;
  OperationConfig *config;
  OutStruct *outs;
  per_transfer *per;
  size_t rc;
  void *userdata_local;
  size_t nmemb_local;
  size_t sz_local;
  char *buffer_local;
  
  lVar2 = *(long *)((long)userdata + 0x10);
  __n = (char *)(sz * nmemb);
  bVar1 = *(byte *)(*(long *)(lVar2 + 0x4c8) + 6);
  buffer_local = (char *)(long)(int)(uint)(__n == (char *)0x0);
  if ((*(long *)((long)userdata + 0xd8) != 0) ||
     (_Var3 = tool_create_output_file
                        ((OutStruct *)((long)userdata + 200),
                         *(OperationConfig **)((long)userdata + 0x10)), _Var3)) {
    if (((bVar1 & 1) == 0) ||
       (((1999 < *(long *)((long)userdata + 0xe0) || ((*(byte *)(lVar2 + 0x30f) & 1) != 0)) ||
        (pvVar5 = memchr(buffer,0,(size_t)__n), pvVar5 == (void *)0x0)))) {
      pcVar6 = (char *)fwrite(buffer,sz,nmemb,*(FILE **)((long)userdata + 0xd8));
      if (__n == pcVar6) {
        *(char **)((long)userdata + 0xe0) = __n + *(long *)((long)userdata + 0xe0);
      }
      if ((*(byte *)(lVar2 + 0x30a) & 1) != 0) {
        *(undefined1 *)(lVar2 + 0x30a) = 0;
        curl_easy_pause(*(undefined8 *)((long)userdata + 0x18),0);
      }
      if (((*(byte *)(lVar2 + 0x309) & 1) == 0) ||
         (iVar4 = fflush(*(FILE **)((long)userdata + 0xd8)), iVar4 == 0)) {
        buffer_local = pcVar6;
      }
    }
    else {
      warnf(*(GlobalConfig **)(lVar2 + 0x4c8),
            "Binary output can mess up your terminal. Use \"--output -\" to tell curl to output it to your terminal anyway, or consider \"--output <FILE>\" to save to a file.\n"
           );
      *(undefined4 *)(lVar2 + 0x4ac) = 1;
    }
  }
  return (size_t)buffer_local;
}

Assistant:

size_t tool_write_cb(char *buffer, size_t sz, size_t nmemb, void *userdata)
{
  size_t rc;
  struct per_transfer *per = userdata;
  struct OutStruct *outs = &per->outs;
  struct OperationConfig *config = per->config;
  size_t bytes = sz * nmemb;
  bool is_tty = config->global->isatty;
#ifdef WIN32
  CONSOLE_SCREEN_BUFFER_INFO console_info;
  intptr_t fhnd;
#endif

  /*
   * Once that libcurl has called back tool_write_cb() the returned value
   * is checked against the amount that was intended to be written, if
   * it does not match then it fails with CURLE_WRITE_ERROR. So at this
   * point returning a value different from sz*nmemb indicates failure.
   */
  const size_t failure = bytes ? 0 : 1;

#ifdef DEBUGBUILD
  {
    char *tty = curlx_getenv("CURL_ISATTY");
    if(tty) {
      is_tty = TRUE;
      curl_free(tty);
    }
  }

  if(config->show_headers) {
    if(bytes > (size_t)CURL_MAX_HTTP_HEADER) {
      warnf(config->global, "Header data size exceeds single call write "
            "limit!\n");
      return failure;
    }
  }
  else {
    if(bytes > (size_t)CURL_MAX_WRITE_SIZE) {
      warnf(config->global, "Data size exceeds single call write limit!\n");
      return failure;
    }
  }

  {
    /* Some internal congruency checks on received OutStruct */
    bool check_fails = FALSE;
    if(outs->filename) {
      /* regular file */
      if(!*outs->filename)
        check_fails = TRUE;
      if(!outs->s_isreg)
        check_fails = TRUE;
      if(outs->fopened && !outs->stream)
        check_fails = TRUE;
      if(!outs->fopened && outs->stream)
        check_fails = TRUE;
      if(!outs->fopened && outs->bytes)
        check_fails = TRUE;
    }
    else {
      /* standard stream */
      if(!outs->stream || outs->s_isreg || outs->fopened)
        check_fails = TRUE;
      if(outs->alloc_filename || outs->is_cd_filename || outs->init)
        check_fails = TRUE;
    }
    if(check_fails) {
      warnf(config->global, "Invalid output struct data for write callback\n");
      return failure;
    }
  }
#endif

  if(!outs->stream && !tool_create_output_file(outs, per->config))
    return failure;

  if(is_tty && (outs->bytes < 2000) && !config->terminal_binary_ok) {
    /* binary output to terminal? */
    if(memchr(buffer, 0, bytes)) {
      warnf(config->global, "Binary output can mess up your terminal. "
            "Use \"--output -\" to tell curl to output it to your terminal "
            "anyway, or consider \"--output <FILE>\" to save to a file.\n");
      config->synthetic_error = ERR_BINARY_TERMINAL;
      return failure;
    }
  }

#ifdef WIN32
  fhnd = _get_osfhandle(fileno(outs->stream));
  if(isatty(fileno(outs->stream)) &&
     GetConsoleScreenBufferInfo((HANDLE)fhnd, &console_info)) {
    DWORD in_len = (DWORD)(sz * nmemb);
    wchar_t* wc_buf;
    DWORD wc_len;

    /* calculate buffer size for wide characters */
    wc_len = MultiByteToWideChar(CP_UTF8, 0, buffer, in_len,  NULL, 0);
    wc_buf = (wchar_t*) malloc(wc_len * sizeof(wchar_t));
    if(!wc_buf)
      return failure;

    /* calculate buffer size for multi-byte characters */
    wc_len = MultiByteToWideChar(CP_UTF8, 0, buffer, in_len, wc_buf, wc_len);
    if(!wc_len) {
      free(wc_buf);
      return failure;
    }

    if(!WriteConsoleW(
        (HANDLE) fhnd,
        wc_buf,
        wc_len,
        &wc_len,
        NULL)) {
      free(wc_buf);
      return failure;
    }
    free(wc_buf);
    rc = bytes;
  }
  else
#endif
    rc = fwrite(buffer, sz, nmemb, outs->stream);

  if(bytes == rc)
    /* we added this amount of data to the output */
    outs->bytes += bytes;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  if(config->nobuffer) {
    /* output buffering disabled */
    int res = fflush(outs->stream);
    if(res)
      return failure;
  }

  return rc;
}